

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::FiberBase::FiberBase
          (FiberBase *this,size_t stackSize,ExceptionOrValue *result,SourceLocation location)

{
  size_t local_28;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0036d340;
  local_28 = stackSize;
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0036cd90;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0036cde0;
  this->state = WAITING;
  this->currentInner = (OwnPromiseNode *)0x0;
  (this->onReadyEvent).event = (Event *)0x0;
  heap<kj::_::FiberStack,unsigned_long&>((kj *)&this->stack,&local_28);
  this->result = result;
  FiberStack::initialize((this->stack).ptr,this);
  return;
}

Assistant:

FiberBase::FiberBase(size_t stackSize, _::ExceptionOrValue& result, SourceLocation location)
    : Event(location),  state(WAITING), stack(kj::heap<FiberStack>(stackSize)), result(result) {
  stack->initialize(*this);
  ensureThreadCanRunFibers();
}